

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSSLEVPCMacAlgorithm.cpp
# Opt level: O0

bool __thiscall
OSSLEVPCMacAlgorithm::verifyUpdate(OSSLEVPCMacAlgorithm *this,ByteString *originalData)

{
  CMAC_CTX *ctx;
  bool bVar1;
  int iVar2;
  size_t sVar3;
  uchar *data;
  ByteString *in_RSI;
  MacAlgorithm *in_RDI;
  ByteString dummy;
  ByteString *in_stack_ffffffffffffff88;
  ByteString local_40;
  byte local_1;
  
  bVar1 = MacAlgorithm::verifyUpdate(in_RDI,in_RSI);
  if (bVar1) {
    sVar3 = ByteString::size((ByteString *)0x1b975a);
    if (sVar3 == 0) {
      local_1 = 1;
    }
    else {
      ctx = (CMAC_CTX *)in_RDI[1]._vptr_MacAlgorithm;
      data = ByteString::const_byte_str(in_stack_ffffffffffffff88);
      sVar3 = ByteString::size((ByteString *)0x1b9791);
      iVar2 = CMAC_Update(ctx,data,sVar3);
      if (iVar2 == 0) {
        softHSMLog(3,"verifyUpdate",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/crypto/OSSLEVPCMacAlgorithm.cpp"
                   ,0xcd,"CMAC_Update failed");
        CMAC_CTX_free((CMAC_CTX *)in_RDI[1]._vptr_MacAlgorithm);
        in_RDI[1]._vptr_MacAlgorithm = (_func_int **)0x0;
        ByteString::ByteString((ByteString *)0x1b97fc);
        MacAlgorithm::verifyFinal(in_RDI,&local_40);
        local_1 = 0;
        ByteString::~ByteString((ByteString *)0x1b981c);
      }
      else {
        local_1 = 1;
      }
    }
  }
  else {
    local_1 = 0;
  }
  return (bool)(local_1 & 1);
}

Assistant:

bool OSSLEVPCMacAlgorithm::verifyUpdate(const ByteString& originalData)
{
	if (!MacAlgorithm::verifyUpdate(originalData))
	{
		return false;
	}

	if (originalData.size() == 0) return true;

	if (!CMAC_Update(curCTX, originalData.const_byte_str(), originalData.size()))
	{
		ERROR_MSG("CMAC_Update failed");

		CMAC_CTX_free(curCTX);
		curCTX = NULL;

		ByteString dummy;
		MacAlgorithm::verifyFinal(dummy);

		return false;
	}

	return true;
}